

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void openjtalk_clearHTSVoiceList(OpenJTalk *oj,HtsVoiceFilelist *list)

{
  HtsVoiceFilelist *__ptr;
  HtsVoiceFilelist *__ptr_00;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    if (list == (HtsVoiceFilelist *)0x0) {
      __ptr = (HtsVoiceFilelist *)0x0;
    }
    else {
      __ptr_00 = (HtsVoiceFilelist *)0x0;
      do {
        __ptr = list;
        if (__ptr_00 != (HtsVoiceFilelist *)0x0) {
          free(__ptr_00);
        }
        if ((__ptr->field_1).pathSjis != (char *)0x0) {
          *(__ptr->field_1).pathSjis = '\0';
        }
        if ((__ptr->field_2).nameSjis != (char *)0x0) {
          *(__ptr->field_2).nameSjis = '\0';
        }
        if ((__ptr->field_1).pathSjis != (char *)0x0) {
          free((__ptr->field_1).pathSjis);
        }
        if ((__ptr->field_2).nameSjis != (char *)0x0) {
          free((__ptr->field_2).nameSjis);
        }
        list = __ptr->succ;
        __ptr_00 = __ptr;
      } while (__ptr->succ != (HtsVoiceFilelist_tag *)0x0);
    }
    if (__ptr != (HtsVoiceFilelist *)0x0) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_clearHTSVoiceList(OpenJTalk *oj, HtsVoiceFilelist *list)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	HtsVoiceFilelist *prev = NULL;

	while (list != NULL)
	{
		if (prev != NULL)
		{
			free(prev);
		}

		if (list->path)
		{
			list->path[0] = '\0';
		}
		if (list->name)
		{
			list->name[0] = '\0';
		}

		if (list->path)
		{
			free(list->path);
		}
		if (list->name)
		{
			free(list->name);
		}

		prev = list;
		list = list->succ;
	}

	if (prev != NULL)
	{
		free(prev);
	}
}